

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DynamicFilter::ToExpression(DynamicFilter *this,Expression *column)

{
  int iVar1;
  DynamicFilterData *pDVar2;
  pthread_mutex_t *__mutex;
  pointer pCVar3;
  BoundConstantExpression *this_00;
  string *this_01;
  Value local_a0;
  Value local_60;
  
  if ((column->super_BaseExpression).alias._M_dataplus._M_p != (pointer)0x0) {
    this_01 = &(column->super_BaseExpression).alias;
    pDVar2 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                       ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_01);
    if (pDVar2->initialized != false) {
      __mutex = (pthread_mutex_t *)
                shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                          ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_01);
      iVar1 = pthread_mutex_lock(__mutex);
      if (iVar1 == 0) {
        pDVar2 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                           ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_01);
        pCVar3 = unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
                 ::operator->(&pDVar2->filter);
        (*(pCVar3->super_TableFilter)._vptr_TableFilter[6])(this,pCVar3);
        pthread_mutex_unlock(__mutex);
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
      ::std::__throw_system_error(iVar1);
    }
  }
  Value::Value(&local_a0,true);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_60,&local_a0);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_60);
  Value::~Value(&local_60);
  Value::~Value(&local_a0);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> DynamicFilter::ToExpression(const Expression &column) const {
	if (!filter_data || !filter_data->initialized) {
		auto bound_constant = make_uniq<BoundConstantExpression>(Value(true));
		return std::move(bound_constant);
	}
	lock_guard<mutex> l(filter_data->lock);
	return filter_data->filter->ToExpression(column);
}